

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_job_queue_init_preallocated
                    (ma_job_queue_config *pConfig,void *pHeap,ma_job_queue *pQueue)

{
  ulong uVar1;
  ma_result mVar2;
  ma_slot_allocator_config allocatorConfig;
  ma_job_queue_heap_layout heapLayout;
  ma_slot_allocator_config local_34;
  ma_job_queue_heap_layout local_30;
  
  if (pQueue != (ma_job_queue *)0x0) {
    memset(pQueue,0,0xc0);
    mVar2 = ma_job_queue_get_heap_layout(pConfig,&local_30);
    if (mVar2 == MA_SUCCESS) {
      pQueue->_pHeap = pHeap;
      if (local_30.sizeInBytes != 0) {
        memset(pHeap,0,local_30.sizeInBytes);
      }
      pQueue->flags = pConfig->flags;
      local_34.capacity = pConfig->capacity;
      pQueue->capacity = local_34.capacity;
      pQueue->pJobs = (ma_job *)(local_30.jobsOffset + (long)pHeap);
      mVar2 = ma_slot_allocator_init_preallocated
                        (&local_34,(void *)((long)pHeap + local_30.allocatorOffset),
                         &pQueue->allocator);
      if (mVar2 == MA_SUCCESS) {
        if ((pQueue->flags & 1) == 0) {
          ma_semaphore_init(L'\0',&pQueue->sem);
        }
        ma_slot_allocator_alloc(&pQueue->allocator,&pQueue->head);
        uVar1 = pQueue->head;
        pQueue->pJobs[uVar1 & 0xffff].next = 0xffffffffffffffff;
        pQueue->tail = uVar1;
        mVar2 = MA_SUCCESS;
      }
    }
    return mVar2;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_job_queue_init_preallocated(const ma_job_queue_config* pConfig, void* pHeap, ma_job_queue* pQueue)
{
    ma_result result;
    ma_job_queue_heap_layout heapLayout;
    ma_slot_allocator_config allocatorConfig;

    if (pQueue == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pQueue);

    result = ma_job_queue_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pQueue->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pQueue->flags    = pConfig->flags;
    pQueue->capacity = pConfig->capacity;
    pQueue->pJobs    = (ma_job*)ma_offset_ptr(pHeap, heapLayout.jobsOffset);

    allocatorConfig = ma_slot_allocator_config_init(pConfig->capacity);
    result = ma_slot_allocator_init_preallocated(&allocatorConfig, ma_offset_ptr(pHeap, heapLayout.allocatorOffset), &pQueue->allocator);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* We need a semaphore if we're running in non-blocking mode. If threading is disabled we need to return an error. */
    if ((pQueue->flags & MA_JOB_QUEUE_FLAG_NON_BLOCKING) == 0) {
        #ifndef MA_NO_THREADING
        {
            ma_semaphore_init(0, &pQueue->sem);
        }
        #else
        {
            /* Threading is disabled and we've requested non-blocking mode. */
            return MA_INVALID_OPERATION;
        }
        #endif
    }

    /*
    Our queue needs to be initialized with a free standing node. This should always be slot 0. Required for the lock free algorithm. The first job in the queue is
    just a dummy item for giving us the first item in the list which is stored in the "next" member.
    */
    ma_slot_allocator_alloc(&pQueue->allocator, &pQueue->head);  /* Will never fail. */
    pQueue->pJobs[ma_job_extract_slot(pQueue->head)].next = MA_JOB_ID_NONE;
    pQueue->tail = pQueue->head;

    return MA_SUCCESS;
}